

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteBlif.c
# Opt level: O1

void Bac_ManWriteBlifLines(FILE *pFile,Bac_Ntk_t *p)

{
  byte *pbVar1;
  Bac_Ntk_t *pBVar2;
  byte bVar3;
  uint uVar4;
  char *pcVar5;
  Mio_Library_t *pLib;
  Mio_Gate_t *pGate;
  char *pcVar6;
  ulong uVar7;
  int iPin;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  bool bVar14;
  
  if (0 < (p->vType).nSize) {
    lVar8 = 1;
    uVar9 = 0xffffffffffffffff;
    lVar11 = 2;
    uVar13 = 0;
    do {
      bVar3 = (p->vType).pArray[uVar13];
      if (0xffffffbb < (bVar3 >> 1) - 0x49) {
        if ((bVar3 & 0xfe) == 0x78) {
          if (bVar3 < 10) {
LAB_0039c91c:
            __assert_fail("Bac_ObjIsBox(p, i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                          ,0x13d,"int Bac_BoxNtkId(Bac_Ntk_t *, int)");
          }
          if ((long)(p->vFanin).nSize <= (long)uVar13) {
LAB_0039c8fd:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          pcVar5 = Abc_NamStr(p->pDesign->pMods,(p->vFanin).pArray[uVar13]);
          pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
          pGate = Mio_LibraryReadGateByName(pLib,pcVar5,(char *)0x0);
          fprintf((FILE *)pFile,".gate %s",pcVar5);
          if (uVar13 != 0) {
            iPin = 0;
            uVar10 = uVar13 & 0xffffffff;
            uVar7 = uVar9;
            do {
              if ((p->vType).nSize < (int)uVar10) goto LAB_0039c8de;
              if (((p->vType).pArray[uVar7 & 0xffffffff] & 0xfeU) != 6) break;
              pcVar5 = Mio_GateReadPinName(pGate,iPin);
              pcVar6 = Bac_ObjNameStr(p,(int)uVar7);
              fprintf((FILE *)pFile," %s=%s",pcVar5,pcVar6);
              iPin = iPin + 1;
              uVar10 = (ulong)((int)uVar10 - 1);
              bVar14 = uVar7 != 0;
              uVar7 = uVar7 - 1;
            } while (bVar14);
          }
          lVar12 = lVar8;
          if ((long)(uVar13 + 1) < (long)(p->vType).nSize) {
            do {
              if (((p->vType).pArray[lVar12] & 0xfeU) != 8) break;
              pcVar5 = Mio_GateReadOutName(pGate);
              pcVar6 = Bac_ObjNameStr(p,(int)lVar12);
              fprintf((FILE *)pFile," %s=%s",pcVar5,pcVar6);
              lVar12 = lVar12 + 1;
            } while ((int)lVar12 < (p->vType).nSize);
          }
          fputc(10,(FILE *)pFile);
        }
        else if ((bVar3 & 0xfe) == 10) {
          fwrite(".subckt",7,1,(FILE *)pFile);
          if ((long)(p->vType).nSize <= (long)uVar13) {
LAB_0039c8de:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                          ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
          }
          if (((byte)(p->vType).pArray[uVar13] >> 1) - 0x49 < 0xffffffbc) goto LAB_0039c91c;
          if ((long)(p->vFanin).nSize <= (long)uVar13) goto LAB_0039c8fd;
          uVar4 = (p->vFanin).pArray[uVar13];
          pBVar2 = p->pDesign->pNtks;
          pcVar5 = Abc_NamStr((pBVar2[uVar4].pDesign)->pStrs,pBVar2[uVar4].NameId);
          fprintf((FILE *)pFile," %s",pcVar5);
          Bac_ManWriteBlifArray2(pFile,p,(int)uVar13);
        }
        else {
          fwrite(".names",6,1,(FILE *)pFile);
          lVar12 = lVar8;
          if (uVar13 != 0) {
            do {
              if ((p->vType).nSize < (int)lVar12 + -1) goto LAB_0039c8de;
              uVar7 = lVar12 - 2U & 0xffffffff;
              if (((p->vType).pArray[uVar7] & 0xfeU) != 6) break;
              if ((p->vFanin).nSize < (int)lVar12 + -1) goto LAB_0039c8fd;
              pcVar5 = Bac_ObjNameStr(p,(p->vFanin).pArray[uVar7]);
              fprintf((FILE *)pFile," %s",pcVar5);
              lVar12 = lVar12 + -1;
            } while (1 < lVar12);
          }
          uVar4 = (p->vType).nSize;
          uVar7 = (ulong)(int)uVar4;
          if ((long)(uVar13 + 1) < (long)uVar7) {
            bVar3 = (p->vType).pArray[lVar8];
            lVar12 = lVar11;
            while (uVar4 = (uint)uVar7, (bVar3 & 0xfe) == 8) {
              pcVar5 = Bac_ObjNameStr(p,(int)lVar12 + -1);
              fprintf((FILE *)pFile," %s",pcVar5);
              uVar4 = (p->vType).nSize;
              uVar7 = (ulong)uVar4;
              if ((int)uVar4 <= (int)lVar12) break;
              pbVar1 = (byte *)((p->vType).pArray + lVar12);
              lVar12 = lVar12 + 1;
              bVar3 = *pbVar1;
            }
          }
          if ((long)(int)uVar4 <= (long)uVar13) goto LAB_0039c8de;
          bVar3 = ((byte)(p->vType).pArray[uVar13] >> 1) - 6;
          if (0xf < bVar3) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                          ,0x3c0,"char *Ptr_TypeToSop(Bac_ObjType_t)");
          }
          fprintf((FILE *)pFile,"\n%s",&DAT_0096f24c + *(int *)(&DAT_0096f24c + (ulong)bVar3 * 4));
        }
      }
      uVar13 = uVar13 + 1;
      lVar8 = lVar8 + 1;
      uVar9 = uVar9 + 1;
      lVar11 = lVar11 + 1;
    } while ((long)uVar13 < (long)(p->vType).nSize);
  }
  return;
}

Assistant:

void Bac_ManWriteBlifLines( FILE * pFile, Bac_Ntk_t * p )
{
    int i, k, iTerm;
    Bac_NtkForEachBox( p, i )
    {
        if ( Bac_ObjIsBoxUser(p, i) )
        {
            fprintf( pFile, ".subckt" );
            fprintf( pFile, " %s", Bac_NtkName(Bac_BoxNtk(p, i)) );
            Bac_ManWriteBlifArray2( pFile, p, i );
        }
        else if ( Bac_ObjIsGate(p, i) )
        {
            char * pGateName = Abc_NamStr(p->pDesign->pMods, Bac_BoxNtkId(p, i));
            Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
            Mio_Gate_t * pGate = Mio_LibraryReadGateByName( pLib, pGateName, NULL );
            fprintf( pFile, ".gate %s", pGateName );
            Bac_BoxForEachBi( p, i, iTerm, k )
                fprintf( pFile, " %s=%s", Mio_GateReadPinName(pGate, k), Bac_ObjNameStr(p, iTerm) );
            Bac_BoxForEachBo( p, i, iTerm, k )
                fprintf( pFile, " %s=%s", Mio_GateReadOutName(pGate), Bac_ObjNameStr(p, iTerm) );
            fprintf( pFile, "\n" );
        }
        else
        {
            fprintf( pFile, ".names" );
            Bac_BoxForEachBi( p, i, iTerm, k )
                fprintf( pFile, " %s", Bac_ObjNameStr(p, Bac_ObjFanin(p, iTerm)) );
            Bac_BoxForEachBo( p, i, iTerm, k )
                fprintf( pFile, " %s", Bac_ObjNameStr(p, iTerm) );
            fprintf( pFile, "\n%s",  Ptr_TypeToSop(Bac_ObjType(p, i)) );
        }
    }
}